

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4hc.c
# Opt level: O2

int LZ4_compressHC2_limitedOutput_withStateHC
              (void *state,char *src,char *dst,int srcSize,int maxDstSize,int cLevel)

{
  int iVar1;
  
  if (((ulong)state & 7) == 0 && state != (void *)0x0) {
    memset(state,0,0x40030);
    *(undefined2 *)((long)state + 0x40024) = 9;
    iVar1 = LZ4_compress_HC_extStateHC_fastReset(state,src,dst,srcSize,maxDstSize,cLevel);
    return iVar1;
  }
  return 0;
}

Assistant:

int LZ4_compressHC2_limitedOutput_withStateHC (void* state, const char* src, char* dst, int srcSize, int maxDstSize, int cLevel) { return LZ4_compress_HC_extStateHC(state, src, dst, srcSize, maxDstSize, cLevel); }